

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

void strunescape(char *s)

{
  wchar_t wVar1;
  long lVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  char hex [3];
  byte local_2b;
  byte local_2a;
  undefined1 local_29;
  
  bVar4 = *s;
  if (bVar4 != 0) {
    pbVar5 = (byte *)s;
    do {
      pbVar3 = pbVar5 + 1;
      if (bVar4 != 0x5c) {
        *s = bVar4;
        s = (char *)((byte *)s + 1);
        goto LAB_00215996;
      }
      bVar4 = *pbVar3;
      if (bVar4 < 0x6e) {
        switch(bVar4) {
        case 0x5c:
          *s = 0x5c;
          break;
        case 0x5d:
        case 0x5e:
        case 0x5f:
        case 0x60:
        case 99:
        case 100:
switchD_002158c0_caseD_5d:
          *s = 0x5c;
          ((byte *)s)[1] = *pbVar3;
          s = (char *)((byte *)s + 2);
          goto LAB_0021598b;
        case 0x61:
          *s = 7;
          break;
        case 0x62:
          *s = 8;
          break;
        case 0x65:
          *s = 0x1b;
          break;
        case 0x66:
          *s = 0xc;
          break;
        default:
          if (bVar4 != 0x30) {
            if (bVar4 != 0) goto switchD_002158c0_caseD_5d;
            goto LAB_002159e7;
          }
          *s = 0;
        }
      }
      else {
        switch(bVar4) {
        case 0x6e:
          *s = 10;
          break;
        default:
          goto switchD_002158c0_caseD_5d;
        case 0x72:
          *s = 0xd;
          break;
        case 0x74:
          *s = 9;
          break;
        case 0x76:
          *s = 0xb;
          break;
        case 0x78:
          local_2b = pbVar5[2];
          if (local_2b != 0) {
            local_2a = pbVar5[3];
            if (local_2a == 0) {
              pbVar3 = pbVar5 + 3;
              ((byte *)s)[0] = 0x5c;
              ((byte *)s)[1] = 0x78;
              ((byte *)s)[2] = local_2b;
              s = (char *)((byte *)s + 3);
              goto LAB_00215996;
            }
            local_29 = 0;
            wVar1 = hex_str_to_int((char *)&local_2b);
            if (wVar1 == L'\xffffffff') {
              ((byte *)s)[0] = 0x5c;
              ((byte *)s)[1] = 0x78;
              ((byte *)s)[2] = local_2b;
              ((byte *)s)[3] = local_2a;
              s = (char *)((byte *)s + 4);
            }
            *s = (byte)wVar1;
            s = (char *)((byte *)s + 1);
            lVar2 = 3;
            goto LAB_00215990;
          }
          pbVar3 = pbVar5 + 2;
          ((byte *)s)[0] = 0x5c;
          ((byte *)s)[1] = 0x78;
          s = (char *)((byte *)s + 2);
          goto LAB_00215996;
        }
      }
      s = (char *)((byte *)s + 1);
LAB_0021598b:
      lVar2 = 1;
LAB_00215990:
      pbVar3 = pbVar5 + lVar2 + 1;
LAB_00215996:
      bVar4 = *pbVar3;
      pbVar5 = pbVar3;
    } while (bVar4 != 0);
  }
LAB_002159e7:
  *s = 0;
  return;
}

Assistant:

void strunescape(char *s) {
	char *in = s;
	char *out = s;
	bool unescapenext = false;

	while (*in) {
		if (unescapenext) {
			unescapenext = false;

			switch (*in) {
			case '0':
				*out++ = '\0';
				break;
			case 'a':
				*out++ = '\a';
				break;
			case 'b':
				*out++ = '\b';
				break;
			case 't':
				*out++ = '\t';
				break;
			case 'n':
				*out++ = '\n';
				break;
			case 'v':
				*out++ = '\v';
				break;
			case 'f':
				*out++ = '\f';
				break;
			case 'r':
				*out++ = '\r';
				break;
			case '\\':
				*out++ = '\\';
				break;
			case 'e':
				*out++ = '\x1B';
				break;
			case 'x': {
				char hex[3];
				if (*++in == 0) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					continue;
				}
				hex[0] = *in;
				if (*++in == 0) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					*out++ = hex[0];
					continue;
				}
				hex[1] = *in;
				hex[2] = 0;
				int result = hex_str_to_int(hex);
				if (result == -1) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					*out++ = hex[0];
					*out++ = hex[1];
				}
				*out++ = result;
				break;
				}
			default:
				/* Add back the unmodified sequence */
				*out++ = '\\';
				*out++ = *in;
				break;
			}

			in++;
			continue;
		}

		if (*in == '\\') {
			unescapenext = true;
			in++;
			continue;
		}

		*out++ = *in++;
	}

	*out = 0;
}